

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_bufs.c
# Opt level: O0

MPP_RET hal_bufs_deinit(HalBufs bufs)

{
  MPP_RET MVar1;
  MPP_RET local_24;
  MPP_RET ret;
  HalBufsImpl *impl;
  HalBufs bufs_local;
  
  if (bufs == (HalBufs)0x0) {
    _mpp_log_l(2,"hal_bufs","invalid NULL input\n","hal_bufs_deinit");
    bufs_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","enter\n","hal_bufs_deinit");
    }
    local_24 = hal_bufs_clear((HalBufsImpl *)bufs);
    if (*bufs != 0) {
      MVar1 = mpp_buffer_group_put(*bufs);
      local_24 = MVar1 | local_24;
      *(undefined8 *)bufs = 0;
    }
    memset(bufs,0,0x68);
    if (bufs != (HalBufs)0x0) {
      mpp_osal_free("hal_bufs_deinit",bufs);
    }
    if ((hal_bufs_debug & 1) != 0) {
      _mpp_log_l(4,"hal_bufs","leave\n","hal_bufs_deinit");
    }
    bufs_local._4_4_ = local_24;
  }
  return bufs_local._4_4_;
}

Assistant:

MPP_RET hal_bufs_deinit(HalBufs bufs)
{
    HalBufsImpl *impl = (HalBufsImpl *)bufs;
    MPP_RET ret = MPP_OK;

    if (NULL == bufs) {
        mpp_err_f("invalid NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    hal_bufs_enter();

    ret = hal_bufs_clear(impl);

    if (impl->group) {
        ret |= mpp_buffer_group_put(impl->group);
        impl->group = NULL;
    }

    memset(impl, 0, sizeof(*impl));
    MPP_FREE(impl);

    hal_bufs_leave();

    return ret;
}